

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run1L1Q1P.cpp
# Opt level: O1

int main(void)

{
  double *pdVar1;
  Scalar SVar2;
  time_t tVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  Matrix<double,__1,__1,_0,_4,_4> *pMVar8;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar9;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar10;
  byte bVar11;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  lPairs;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  plPairs;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ptPairs;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  estTrans;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  lCPairs;
  Matrix<double,_4,_4,_0,_4,_4> estT;
  Matrix<double,_4,_4,_0,_4,_4> transGT;
  time_t t;
  Matrix<double,_3,_3,_0,_3,_3> R;
  AngleAxis<double> axAng;
  scalar_sum_op<double,_double> local_531;
  double local_530;
  Matrix<double,__1,__1,_0,_4,_4> local_528;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_498;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_478;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_458;
  vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  local_440;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_428;
  long local_410;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_408;
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  local_3f0;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_3d8;
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  local_3c0;
  Product<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>,_1>
  local_3a8;
  double local_338;
  double dStack_330;
  double local_328;
  double dStack_320;
  double local_318;
  double dStack_310;
  double local_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  Matrix<double,_4,_4,_0,_4,_4> local_2b8;
  time_t local_230;
  double local_228;
  double *pdStack_220;
  double local_218;
  double dStack_210;
  DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *local_208;
  double dStack_200;
  double local_1f8;
  double dStack_1f0;
  double *local_1e8;
  AngleAxis<double> local_1d8;
  Matrix<double,_4,_4,_0,_4,_4> local_1b8;
  Matrix<double,_4,_4,_0,_4,_4> local_138;
  Matrix<double,_4,_4,_0,_4,_4> local_b8;
  
  bVar11 = 0;
  tVar3 = time(&local_230);
  srand((uint)tVar3);
  local_458.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_478.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.
  super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_498.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_498.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_428.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_428.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_428.
  super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  getGTTransformations<double>((Matrix<double,_4,_4,_0,_4,_4> *)&local_528,false);
  pMVar8 = &local_528;
  pMVar9 = &local_2b8;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array[0]
         = (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>).m_storage.m_data
           .array[0];
    pMVar8 = (Matrix<double,__1,__1,_0,_4,_4> *)((long)pMVar8 + ((ulong)bVar11 * -2 + 1) * 8);
    pMVar9 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  pMVar9 = &local_2b8;
  pMVar10 = &local_b8;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar9 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  genLineIntPair<double>
            ((pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_528,&local_b8);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
  ::
  emplace_back<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
            ((vector<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>,std::allocator<std::pair<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>>
              *)&local_498,
             (pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)&local_528);
  pMVar9 = &local_2b8;
  pMVar10 = &local_138;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar9 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  genPointPair<double>
            ((pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
             &local_528,&local_138);
  std::
  vector<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::allocator<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
  ::emplace_back<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>
            ((vector<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::allocator<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
              *)&local_458,
             (pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
             &local_528);
  pMVar9 = &local_2b8;
  pMVar10 = &local_1b8;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.array
    [0] = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0];
    pMVar9 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar9 + ((ulong)bVar11 * -2 + 1) * 8);
    pMVar10 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar10 + ((ulong)bVar11 * -2 + 1) * 8);
  }
  genPlanePair<double>
            ((pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
             &local_528,&local_1b8);
  std::
  vector<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::allocator<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
  ::emplace_back<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>
            ((vector<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>,std::allocator<std::pair<Eigen::Matrix<double,4,1,0,4,1>,Eigen::Matrix<double,4,1,0,4,1>>>>
              *)&local_478,
             (pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
             &local_528);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"GT transformation: ",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)&local_2b8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  lVar6 = std::chrono::_V2::system_clock::now();
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector(&local_3c0,&local_458);
  std::
  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
  ::vector(&local_3d8,&local_478);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::vector(&local_3f0,&local_498);
  std::
  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
  ::vector(&local_408,&local_428);
  solver1L1Q1P<double>(&local_440,&local_3c0,&local_3d8,&local_3f0,&local_408);
  if (local_408.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_408.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3f0.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3f0.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3f0.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3f0.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3d8.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d8.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3d8.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3d8.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_3c0.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3c0.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_3c0.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3c0.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar5 = std::chrono::_V2::system_clock::now();
  if (local_440.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_440.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_410 = (lVar5 - lVar6) / 1000;
    local_530 = 1000.0;
    lVar6 = 0x70;
    uVar7 = 0;
    do {
      pdVar1 = (double *)
               ((long)((local_440.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x70);
      local_338 = *pdVar1;
      dStack_330 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_440.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x60);
      local_328 = *pdVar1;
      dStack_320 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_440.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x50);
      local_318 = *pdVar1;
      dStack_310 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_440.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x40);
      local_308 = *pdVar1;
      dStack_300 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_440.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x30);
      local_2f8 = *pdVar1;
      dStack_2f0 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_440.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x20);
      local_2e8 = *pdVar1;
      dStack_2e0 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_440.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6 + -0x10);
      local_2d8 = *pdVar1;
      dStack_2d0 = pdVar1[1];
      pdVar1 = (double *)
               ((long)((local_440.
                        super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data
                      .array + lVar6);
      local_2c8 = *pdVar1;
      dStack_2c0 = pdVar1[1];
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[1] = (double)&local_2d8;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[2] = 1.48219693752374e-323;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[3] = 4.94065645841247e-324;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[5] = 0.0;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[6] = 1.48219693752374e-323;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[7] = 1.97626258336499e-323;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[8] = (double)(local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array + 0xc);
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[9] = 1.48219693752374e-323;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[10] = 4.94065645841247e-324;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xb] = (double)&local_2b8;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xc] = 0.0;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xd] = 1.48219693752374e-323;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[0xe] = 1.97626258336499e-323;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
      array[4] = (double)&local_338;
      local_3a8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = (long)local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                      m_storage.m_data.array[1];
      local_3a8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = (long)local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                      m_storage.m_data.array[8];
      SVar2 = Eigen::internal::
              redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const>const>>,4,0>
              ::
              run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const>const>>
                        ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>_>
                          *)&local_3a8,&local_531,
                         (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
                          *)&local_528);
      if (SQRT(SVar2) < local_530) {
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[1] = (double)&local_2d8;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[2] = 1.48219693752374e-323;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[3] = 4.94065645841247e-324;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[5] = 0.0;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 1.48219693752374e-323;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[7] = 1.97626258336499e-323;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[8] = (double)(local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                            m_storage.m_data.array + 0xc);
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[9] = 1.48219693752374e-323;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[10] = 4.94065645841247e-324;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = (double)&local_2b8;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = 0.0;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = 1.48219693752374e-323;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = 1.97626258336499e-323;
        local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_data.
        array[4] = (double)&local_338;
        local_3a8.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = (long)local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                        m_storage.m_data.array[1];
        local_3a8.m_lhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
        m_value = (long)local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                        m_storage.m_data.array[8];
        SVar2 = Eigen::internal::
                redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,-1,-1,false>const>const>>,4,0>
                ::
                run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>const>const>>
                          ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>_>
                            *)&local_3a8,&local_531,
                           (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>_>_>
                            *)&local_528);
        local_530 = SQRT(SVar2);
      }
      local_3a8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = 0;
      local_3a8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
      m_value = 0;
      local_3a8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
      m_value = 0;
      local_3a8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
      m_value = 0;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_rows = 3;
      local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_cols = 3;
      local_3a8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 3;
      local_3a8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 3;
      local_3a8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride
           = 4;
      local_3a8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
           (PointerType)&local_2b8;
      local_3a8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
      m_value = 3;
      local_3a8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
      m_value = 3;
      local_3a8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_outerStride
           = 4;
      local_3a8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
           (PointerType)&local_338;
      local_3a8.m_lhs.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)&local_338;
      local_3a8.m_rhs.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
           (XprTypeNested)
           local_3a8.m_rhs.m_matrix.
           super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.
           m_data;
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,4,4>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>>,1>,Eigen::internal::assign_op<double,double>>
                (&local_528,&local_3a8,(assign_op<double,_double> *)&local_531);
      if ((local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_rows
           != 3) ||
         (local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage.m_cols
          != 3)) {
        __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                      "void Eigen::PlainObjectBase<Eigen::Matrix<double, 3, 3>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 3, 3>]"
                     );
      }
      local_228 = local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage
                  .m_data.array[0];
      pdStack_220 = (double *)
                    local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                    m_storage.m_data.array[1];
      local_218 = local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage
                  .m_data.array[2];
      dStack_210 = local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                   m_storage.m_data.array[3];
      local_208 = (DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                  local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage
                  .m_data.array[4];
      dStack_200 = local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                   m_storage.m_data.array[5];
      local_1f8 = local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage
                  .m_data.array[6];
      dStack_1f0 = local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.
                   m_storage.m_data.array[7];
      local_1e8 = (double *)
                  local_528.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,_4,_4>_>.m_storage
                  .m_data.array[8];
      Eigen::AngleAxis<double>::fromRotationMatrix<Eigen::Matrix<double,3,3,0,3,3>>
                (&local_1d8,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_228);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Estimated Transformation:",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      poVar4 = (ostream *)std::ostream::flush();
      poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)
                                        &local_338);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Error (frob norm): ",0x13);
      poVar4 = std::ostream::_M_insert<double>
                         (SQRT((local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xf] - dStack_2c0) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xf] - dStack_2c0) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xd] - dStack_2d0) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xd] - dStack_2d0) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xb] - dStack_2e0) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xb] - dStack_2e0) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[9] - dStack_2f0) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[9] - dStack_2f0) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] - dStack_300) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[7] - dStack_300) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5] - dStack_310) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[5] - dStack_310) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[3] - dStack_320) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[3] - dStack_320) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[1] - dStack_330) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[1] - dStack_330) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xe] - local_2c8) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xe] - local_2c8) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xc] - local_2d8) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0xc] - local_2d8) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[10] - local_2e8) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[10] - local_2e8) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[8] - local_2f8) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[8] - local_2f8) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] - local_308) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[6] - local_308) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[4] - local_318) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[4] - local_318) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[2] - local_328) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[2] - local_328) +
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0] - local_338) *
                               (local_2b8.
                                super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                                m_storage.m_data.array[0] - local_338)));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", time: ",8);
      poVar4 = std::ostream::_M_insert<long>((long)poVar4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x80;
    } while (uVar7 < (ulong)((long)local_440.
                                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_440.
                                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 7));
  }
  if (local_440.
      super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_440.
                    super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_440.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_440.
                          super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_428.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_428.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_428.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_428.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_498.
      super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.
                    super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.
                          super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_478.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_478.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_478.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_478.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_458.
      super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_458.
                    super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_458.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_458.
                          super__Vector_base<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(){
    bool verbose = true;
    high_resolution_clock::time_point t1, t2;

    // Intializes random number generator
    time_t t;
    srand((unsigned) time(&t));
    vector<double> timeVector;

    int powIter = 0;
	
    if (powIter > 1 && verbose)
	{
		std::cerr << "ERR: check the number of iterations and the verbose option..." << std::endl;
		return 0;
	}

    vector<unsigned int> numSols;
    vector<double> transErrors;
    vector<double> rotErrors;
    Matrix<double, 4,4> transGT;
    std::vector<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>> ptPairs;
	std::vector<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>> plPairs;
	std::vector<std::pair<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>,std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>>> lPairs;
    std::vector<std::pair<std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>,std::pair<Eigen::Matrix<double,4,1>, Eigen::Matrix<double,4,1>>>> lCPairs;
    for (int iter = 0 ; iter < pow(10,powIter) ; iter++){ 
	    transGT = getGTTransformations<double>();

        lPairs.push_back(genLineIntPair<double>(transGT));
        ptPairs.push_back(genPointPair<double>(transGT));
        plPairs.push_back(genPlanePair<double>(transGT));

        if(verbose){
            cout << "GT transformation: " << endl;
            cout << transGT << endl;
        }

        // test solver
	    t1 = high_resolution_clock::now();
	    // run solver
        vector<Matrix<double, 4,4>> estTrans = solver1L1Q1P<double>(ptPairs,plPairs,lPairs,lCPairs);
	    t2 = high_resolution_clock::now();
	    auto duration = duration_cast<microseconds>( t2 - t1 ).count();

        Matrix<double, 4,4> estT;
        Matrix<double, 3,3> R;
        double transError = 1000;
        double rotError = 1000;
        AngleAxis<double> axAng;
        for(int iiter= 0; iiter < estTrans.size(); iiter++){
                estT = estTrans[iiter];
                if( (estT.topRightCorner(3,1) - transGT.topRightCorner(3,1)).norm() < transError)
                    transError = (estT.topRightCorner(3,1) - transGT.topRightCorner(3,1)).norm();
                R = estT.topLeftCorner(3,3)*transGT.topLeftCorner(3,3).transpose();
                axAng.fromRotationMatrix(R);
                if( abs(axAng.angle()) < rotError)
                    rotError = abs(axAng.angle());
                if (verbose) cout << "Estimated Transformation:" << endl << estT << endl;
	            if (verbose) cout << "Error (frob norm): " << (transGT-estT).norm() << ", time: " << duration << endl;        
        }         

    }

    return 0;
}